

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testwinprops.cpp
# Opt level: O1

void testwin3(wins *wins_ar,int ar_len)

{
  undefined8 *puVar1;
  long *plVar2;
  ulong uVar3;
  undefined8 uVar4;
  long lVar5;
  Am_Style local_38 [8];
  
  uVar3 = (ulong)(uint)ar_len;
  if (0 < ar_len) {
    lVar5 = 0;
    do {
      puVar1 = *(undefined8 **)((long)&wins_ar->root + lVar5);
      Am_Style::Am_Style(local_38,(Am_Style *)&red);
      uVar4 = (**(code **)*puVar1)
                        (puVar1,10,0x32,200,200,"D3","D3 Icon",1,1,local_38,0,1,1,0,0,1,0,0,1,0);
      Am_Style::~Am_Style(local_38);
      *(undefined8 *)((long)&wins_ar->d3 + lVar5) = uVar4;
      lVar5 = lVar5 + 0x40;
    } while (uVar3 << 6 != lVar5);
  }
  printf("Hit RETURN to de-iconify red window:");
  getchar();
  if (0 < ar_len) {
    lVar5 = 0;
    do {
      plVar2 = *(long **)((long)&wins_ar->d3 + lVar5);
      (**(code **)(*plVar2 + 0x38))(plVar2,0);
      lVar5 = lVar5 + 0x40;
    } while (uVar3 << 6 != lVar5);
  }
  printf("Hit RETURN to re-iconify red window:");
  getchar();
  if (0 < ar_len) {
    lVar5 = 0;
    do {
      plVar2 = *(long **)((long)&wins_ar->d3 + lVar5);
      (**(code **)(*plVar2 + 0x38))(plVar2,1);
      lVar5 = lVar5 + 0x40;
    } while (uVar3 << 6 != lVar5);
  }
  return;
}

Assistant:

void
testwin3(wins *wins_ar, int ar_len)
{
  //printf("Hit RETURN to bring up iconified window:");
  //getchar();

  int i;
  for (i = 0; i < ar_len; i++) {
    Am_Drawonable *the_d3 =
        (wins_ar[i].root)
            ->Create(10, 50, 200, 200, "D3", "D3 Icon", true, true, red);
    wins_ar[i].d3 = the_d3;
  }

  printf("Hit RETURN to de-iconify red window:");
  getchar();

  for (i = 0; i < ar_len; i++) {
    (wins_ar[i].d3)->Set_Iconify(false);
  }

  printf("Hit RETURN to re-iconify red window:");
  getchar();

  for (i = 0; i < ar_len; i++) {
    (wins_ar[i].d3)->Set_Iconify(true);
  }
}